

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *this,ExtDepGraph *x)

{
  bool bVar1;
  ExtDepGraph *pEVar2;
  pointer pAVar3;
  ExtDepGraph *in_RSI;
  ExtDepGraph *in_RDI;
  DeleteObject deleter;
  
  pEVar2 = get((SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *)0x19b3d6);
  if ((in_RSI != pEVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *)0x19b3ec), bVar1))
  {
    release((SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  pAVar3 = (pointer)set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  (in_RDI->fwdArcs_).ebo_.buf = pAVar3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}